

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O2

REF_STATUS ref_cloud_item(REF_CLOUD ref_cloud,REF_GLOB global,REF_INT *item)

{
  ulong uVar1;
  ulong uVar2;
  
  *item = -1;
  uVar1 = 0;
  uVar2 = (ulong)(uint)ref_cloud->n;
  if (ref_cloud->n < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return 5;
    }
    if (ref_cloud->global[uVar1] == global) break;
    uVar1 = uVar1 + 1;
  }
  *item = (REF_INT)uVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_item(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_INT *item) {
  REF_INT i;

  *item = REF_EMPTY;

  each_ref_cloud_item(ref_cloud, i) {
    if (global == ref_cloud_global(ref_cloud, i)) {
      *item = i;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}